

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O1

void __thiscall
dynet::FastLSTMBuilder::new_graph_impl(FastLSTMBuilder *this,ComputationGraph *cg,bool update)

{
  pointer pvVar1;
  Parameter PVar2;
  ulong uVar3;
  long lVar4;
  Expression EVar5;
  initializer_list<dynet::Expression> __l;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> vars;
  allocator_type local_1a1;
  undefined8 local_1a0;
  ComputationGraph *local_198;
  undefined8 local_190;
  ComputationGraph *local_188;
  undefined8 local_180;
  ComputationGraph *local_178;
  undefined8 local_170;
  ComputationGraph *local_168;
  undefined8 local_160;
  ComputationGraph *local_158;
  undefined8 local_150;
  ComputationGraph *local_148;
  undefined8 local_140;
  ComputationGraph *local_138;
  undefined8 local_130;
  ComputationGraph *local_128;
  VariableIndex local_120;
  uint uStack_11c;
  ComputationGraph *local_118;
  FastLSTMBuilder *local_110;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_108;
  ulong local_100;
  Expression local_f8;
  ComputationGraph *local_e8;
  undefined8 local_e0;
  ComputationGraph *local_d8;
  undefined8 local_d0;
  ComputationGraph *local_c8;
  undefined8 local_c0;
  ComputationGraph *local_b8;
  undefined8 local_b0;
  ComputationGraph *local_a8;
  undefined8 local_a0;
  ComputationGraph *local_98;
  undefined8 local_90;
  ComputationGraph *local_88;
  undefined8 local_80;
  ComputationGraph *local_78;
  undefined8 local_70;
  Expression local_68;
  Expression local_58;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_48;
  
  local_108 = &this->param_vars;
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::clear(local_108);
  if (this->layers != 0) {
    lVar4 = 0;
    local_100 = 0;
    local_110 = this;
    do {
      pvVar1 = (this->params).
               super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      PVar2.p = (ParameterStorage *)
                **(undefined8 **)
                  ((long)&(pvVar1->
                          super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>).
                          _M_impl.super__Vector_impl_data + lVar4);
      if (update) {
        EVar5 = parameter(cg,PVar2);
      }
      else {
        EVar5 = const_parameter(cg,PVar2);
      }
      _local_120 = EVar5._8_8_;
      local_118 = EVar5.pg;
      PVar2.p = *(ParameterStorage **)
                 (*(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                   )._M_impl.super__Vector_impl_data + lVar4) + 8);
      if (update) {
        EVar5 = parameter(cg,PVar2);
      }
      else {
        EVar5 = const_parameter(cg,PVar2);
      }
      local_130 = EVar5._8_8_;
      local_128 = EVar5.pg;
      PVar2.p = *(ParameterStorage **)
                 (*(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                   )._M_impl.super__Vector_impl_data + lVar4) + 0x10);
      if (update) {
        EVar5 = parameter(cg,PVar2);
      }
      else {
        EVar5 = const_parameter(cg,PVar2);
      }
      local_140 = EVar5._8_8_;
      local_138 = EVar5.pg;
      PVar2.p = *(ParameterStorage **)
                 (*(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                   )._M_impl.super__Vector_impl_data + lVar4) + 0x18);
      if (update) {
        EVar5 = parameter(cg,PVar2);
      }
      else {
        EVar5 = const_parameter(cg,PVar2);
      }
      local_150 = EVar5._8_8_;
      local_148 = EVar5.pg;
      PVar2.p = *(ParameterStorage **)
                 (*(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                   )._M_impl.super__Vector_impl_data + lVar4) + 0x20);
      if (update) {
        EVar5 = parameter(cg,PVar2);
      }
      else {
        EVar5 = const_parameter(cg,PVar2);
      }
      local_160 = EVar5._8_8_;
      local_158 = EVar5.pg;
      PVar2.p = *(ParameterStorage **)
                 (*(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                   )._M_impl.super__Vector_impl_data + lVar4) + 0x28);
      if (update) {
        EVar5 = parameter(cg,PVar2);
      }
      else {
        EVar5 = const_parameter(cg,PVar2);
      }
      local_170 = EVar5._8_8_;
      local_168 = EVar5.pg;
      PVar2.p = *(ParameterStorage **)
                 (*(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                   )._M_impl.super__Vector_impl_data + lVar4) + 0x30);
      if (update) {
        EVar5 = parameter(cg,PVar2);
      }
      else {
        EVar5 = const_parameter(cg,PVar2);
      }
      local_180 = EVar5._8_8_;
      local_178 = EVar5.pg;
      PVar2.p = *(ParameterStorage **)
                 (*(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                   )._M_impl.super__Vector_impl_data + lVar4) + 0x38);
      if (update) {
        EVar5 = parameter(cg,PVar2);
      }
      else {
        EVar5 = const_parameter(cg,PVar2);
      }
      local_190 = EVar5._8_8_;
      local_188 = EVar5.pg;
      PVar2.p = *(ParameterStorage **)
                 (*(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                   )._M_impl.super__Vector_impl_data + lVar4) + 0x40);
      if (update) {
        EVar5 = parameter(cg,PVar2);
      }
      else {
        EVar5 = const_parameter(cg,PVar2);
      }
      local_1a0 = EVar5._8_8_;
      local_198 = EVar5.pg;
      PVar2.p = *(ParameterStorage **)
                 (*(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                   )._M_impl.super__Vector_impl_data + lVar4) + 0x48);
      if (update) {
        EVar5 = parameter(cg,PVar2);
      }
      else {
        EVar5 = const_parameter(cg,PVar2);
      }
      PVar2.p = *(ParameterStorage **)
                 (*(long *)((long)&(pvVar1->
                                   super__Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>
                                   )._M_impl.super__Vector_impl_data + lVar4) + 0x50);
      if (update) {
        local_58 = parameter(cg,PVar2);
      }
      else {
        local_58 = const_parameter(cg,PVar2);
      }
      local_f8.pg = local_118;
      local_f8.i = local_120;
      local_f8.graph_id = uStack_11c;
      local_e8 = local_128;
      local_e0 = local_130;
      local_d8 = local_138;
      local_d0 = local_140;
      local_c8 = local_148;
      local_c0 = local_150;
      local_b8 = local_158;
      local_b0 = local_160;
      local_a8 = local_168;
      local_a0 = local_170;
      local_98 = local_178;
      local_90 = local_180;
      local_88 = local_188;
      local_80 = local_190;
      local_78 = local_198;
      local_70 = local_1a0;
      __l._M_len = 0xb;
      __l._M_array = &local_f8;
      local_68 = EVar5;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                (&local_48,__l,&local_1a1);
      std::
      vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
      ::push_back(local_108,&local_48);
      uVar3 = local_100;
      this = local_110;
      if (local_48.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_100 = uVar3 + 1;
      lVar4 = lVar4 + 0x18;
    } while (local_100 < this->layers);
  }
  return;
}

Assistant:

void FastLSTMBuilder::new_graph_impl(ComputationGraph& cg, bool update){
  param_vars.clear();

  for (unsigned i = 0; i < layers; ++i){
    auto& p = params[i];

    //i
    Expression i_x2i = update ? parameter(cg,p[X2I]) : const_parameter(cg,p[X2I]);
    Expression i_h2i = update ? parameter(cg,p[H2I]) : const_parameter(cg,p[H2I]);
    Expression i_c2i = update ? parameter(cg,p[C2I]) : const_parameter(cg,p[C2I]);
    Expression i_bi = update ? parameter(cg,p[BI]) : const_parameter(cg,p[BI]);
    //o
    Expression i_x2o = update ? parameter(cg,p[X2O]) : const_parameter(cg,p[X2O]);
    Expression i_h2o = update ? parameter(cg,p[H2O]) : const_parameter(cg,p[H2O]);
    Expression i_c2o = update ? parameter(cg,p[C2O]) : const_parameter(cg,p[C2O]);
    Expression i_bo = update ? parameter(cg,p[BO]) : const_parameter(cg,p[BO]);
    //c
    Expression i_x2c = update ? parameter(cg,p[X2C]) : const_parameter(cg,p[X2C]);
    Expression i_h2c = update ? parameter(cg,p[H2C]) : const_parameter(cg,p[H2C]);
    Expression i_bc = update ? parameter(cg,p[BC]) : const_parameter(cg,p[BC]);

    vector<Expression> vars = {i_x2i, i_h2i, i_c2i, i_bi, i_x2o, i_h2o, i_c2o, i_bo, i_x2c, i_h2c, i_bc};
    param_vars.push_back(vars);
  }
}